

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O3

int linenoiseHistorySave(char *filename)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    iVar1 = -1;
  }
  else {
    if (0 < history_len) {
      lVar2 = 0;
      do {
        fprintf(__stream,"%s\n",history[lVar2]);
        lVar2 = lVar2 + 1;
      } while (lVar2 < history_len);
    }
    fclose(__stream);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int linenoiseHistorySave(const char *filename) {
    FILE *fp = fopen(filename,"w");
    int j;

    if (fp == NULL) return -1;
    for (j = 0; j < history_len; j++)
        fprintf(fp,"%s\n",history[j]);
    fclose(fp);
    return 0;
}